

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer3Interrogator.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::IFF_Layer3Interrogator::Encode(IFF_Layer3Interrogator *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  reference this_00;
  StandardVariable *pSVar3;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  IFF_Layer3Interrogator *this_local;
  
  LayerHeader::Encode((LayerHeader *)this,stream);
  pKVar2 = DATA_TYPE::operator<<(stream,&(this->super_IFF_Layer3).m_RptSim.super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_BasicData).super_DataTypeBase);
  pKVar2 = KDataStream::operator<<(pKVar2,(this->super_IFF_Layer3).m_ui16Padding);
  KDataStream::operator<<(pKVar2,(this->super_IFF_Layer3).m_ui16NumIffRecs);
  citrEnd = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
            ::begin(&(this->super_IFF_Layer3).m_vStdVarRecs);
  local_28._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
       ::end(&(this->super_IFF_Layer3).m_vStdVarRecs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
              ::operator*(&citrEnd);
    pSVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::operator->(this_00);
    (*(pSVar3->super_DataTypeBase)._vptr_DataTypeBase[5])(pSVar3,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void IFF_Layer3Interrogator::Encode( KDataStream & stream ) const
{
	LayerHeader::Encode( stream );

    stream << KDIS_STREAM m_RptSim
	       << KDIS_STREAM m_BasicData
		   << m_ui16Padding
		   << m_ui16NumIffRecs;

    vector<KDIS::DATA_TYPE::StdVarPtr>::const_iterator citr = m_vStdVarRecs.begin();
    vector<KDIS::DATA_TYPE::StdVarPtr>::const_iterator citrEnd = m_vStdVarRecs.end();
    for( ; citr != citrEnd; ++citr )
    {
        ( *citr )->Encode( stream );
    }	
}